

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O1

int get_wormno(level *lev)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (lev->wheads[lVar1 + 1] == (wseg *)0x0) {
      return (int)lVar1 + 1;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x1f);
  return 0;
}

Assistant:

int get_wormno(struct level *lev)
{
    int new_wormno = 1;

    while (new_wormno < MAX_NUM_WORMS) {
	if (!lev->wheads[new_wormno])
	    return new_wormno; /* found an empty wtails[] slot at new_wormno */
	new_wormno++;
    }

    return 0;	/* level infested with worms */
}